

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O2

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateB
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ValueType *pVVar8;
  int k;
  int i;
  int iVar9;
  int j;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int local_b0;
  
  dVar11 = dt * 29979245800.0;
  dVar13 = dVar11 / (grid->super_Grid<(pica::Dimension)3,_double>).step.x;
  dVar12 = dVar11 / (grid->super_Grid<(pica::Dimension)3,_double>).step.y;
  dVar11 = dVar11 / (grid->super_Grid<(pica::Dimension)3,_double>).step.z;
  uVar6 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.x;
  uVar7 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
  iVar5 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.z;
  for (iVar9 = 1; iVar9 < (int)uVar6; iVar9 = iVar9 + 1) {
    for (iVar10 = 1; iVar10 < (int)uVar7; iVar10 = iVar10 + 1) {
      for (k = 1; k < iVar5; k = k + 1) {
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar9,iVar10,k);
        dVar1 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar9,iVar10,k + -1);
        dVar2 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar9,iVar10,k);
        dVar3 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar9,iVar10 + -1,k);
        dVar4 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,iVar9,iVar10,k);
        *pVVar8 = (dVar1 - dVar2) * dVar11 + (dVar3 - dVar4) * -dVar12 + *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar9,iVar10,k);
        dVar1 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar9 + -1,iVar10,k);
        dVar2 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,iVar10,k);
        dVar3 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,iVar10,k + -1);
        dVar4 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar9,iVar10,k);
        *pVVar8 = (dVar1 - dVar2) * dVar13 + (dVar3 - dVar4) * -dVar11 + *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,iVar10,k);
        dVar1 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,iVar10 + -1,k);
        dVar2 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar9,iVar10,k);
        dVar3 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar9 + -1,iVar10,k);
        dVar4 = *pVVar8;
        pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar9,iVar10,k);
        *pVVar8 = (dVar1 - dVar2) * dVar12 + (dVar3 - dVar4) * -dVar13 + *pVVar8;
      }
    }
  }
  iVar9 = 1;
  while( true ) {
    if ((int)uVar6 <= iVar9) break;
    for (iVar10 = 1; iVar10 < (int)uVar7; iVar10 = iVar10 + 1) {
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,iVar10,0);
      dVar1 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,iVar10 + -1,0);
      dVar2 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar9,iVar10,0);
      dVar3 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,iVar9 + -1,iVar10,0);
      dVar4 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bz(grid,iVar9,iVar10,0);
      *pVVar8 = (dVar1 - dVar2) * dVar12 + (dVar3 - dVar4) * -dVar13 + *pVVar8;
    }
    iVar9 = iVar9 + 1;
  }
  for (iVar9 = 1; iVar9 < (int)uVar6; iVar9 = iVar9 + 1) {
    for (iVar10 = 1; iVar10 < iVar5; iVar10 = iVar10 + 1) {
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar9,0,iVar10);
      dVar1 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,iVar9 + -1,0,iVar10);
      dVar2 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,0,iVar10);
      dVar3 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ex(grid,iVar9,0,iVar10 + -1);
      dVar4 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::by(grid,iVar9,0,iVar10);
      *pVVar8 = (dVar1 - dVar2) * dVar13 + (dVar3 - dVar4) * -dVar11 + *pVVar8;
    }
  }
  for (iVar9 = 1; iVar9 < (int)uVar7; iVar9 = iVar9 + 1) {
    for (iVar10 = 1; iVar10 < iVar5; iVar10 = iVar10 + 1) {
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,0,iVar9,iVar10);
      dVar13 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ey(grid,0,iVar9,iVar10 + -1);
      dVar1 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,0,iVar9,iVar10);
      dVar2 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::ez(grid,0,iVar9 + -1,iVar10);
      dVar3 = *pVVar8;
      pVVar8 = YeeGrid<(pica::Dimension)3,_double>::bx(grid,0,iVar9,iVar10);
      *pVVar8 = (dVar13 - dVar1) * dVar11 + (dVar2 - dVar3) * -dVar12 + *pVVar8;
    }
  }
  return;
}

Assistant:

static void updateB(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(1, 1, 1);
        const IndexType end = grid.getSize();
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.bx(i, j, k) += coeff.z * (grid.ey(i, j, k) - grid.ey(i, j, k - 1)) -
                coeff.y * (grid.ez(i, j, k) - grid.ez(i, j - 1, k));
            grid.by(i, j, k) += coeff.x * (grid.ez(i, j, k) - grid.ez(i - 1, j, k)) -
                coeff.z * (grid.ex(i, j, k) - grid.ex(i, j, k - 1));
            grid.bz(i, j, k) += coeff.y * (grid.ex(i, j, k) - grid.ex(i, j - 1, k)) -
                coeff.x * (grid.ey(i, j, k) - grid.ey(i - 1, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.bz(i, j, 0) += coeff.y * (grid.ex(i, j, 0) - grid.ex(i, j - 1, 0)) -
                coeff.x * (grid.ey(i, j, 0) - grid.ey(i - 1, j, 0));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.by(i, 0, k) += coeff.x * (grid.ez(i, 0, k) - grid.ez(i - 1, 0, k)) -
                coeff.z * (grid.ex(i, 0, k) - grid.ex(i, 0, k - 1));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.bx(0, j, k) += coeff.z * (grid.ey(0, j, k) - grid.ey(0, j, k - 1)) -
                coeff.y * (grid.ez(0, j, k) - grid.ez(0, j - 1, k));
    }